

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

uint32_t FAudioFXReverb_Initialize(FAudioFXReverb *fapo,void *pData,uint32_t DataByteSize)

{
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  
  SDL_memcpy(*(undefined8 *)(in_RDI + 0xa0),in_RSI,in_EDX);
  SDL_memcpy(*(long *)(in_RDI + 0xa0) + (ulong)in_EDX,in_RSI,in_EDX);
  SDL_memcpy(*(long *)(in_RDI + 0xa0) + (ulong)(in_EDX << 1),in_RSI,in_EDX);
  return 0;
}

Assistant:

uint32_t FAudioFXReverb_Initialize(
	FAudioFXReverb *fapo,
	const void* pData,
	uint32_t DataByteSize
) {
	#define INITPARAMS(offset) \
		FAudio_memcpy( \
			fapo->base.m_pParameterBlocks + DataByteSize * offset, \
			pData, \
			DataByteSize \
		);
	INITPARAMS(0)
	INITPARAMS(1)
	INITPARAMS(2)
	#undef INITPARAMS
	return 0;
}